

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_check_rsa_key_byte_aligned(mbedtls_rsa_context *rsa)

{
  int ret;
  size_t sVar1;
  psa_status_t local_2c;
  undefined1 local_28 [4];
  psa_status_t status;
  mbedtls_mpi n;
  mbedtls_rsa_context *rsa_local;
  
  n.p = (mbedtls_mpi_uint *)rsa;
  mbedtls_mpi_init((mbedtls_mpi *)local_28);
  ret = mbedtls_rsa_export((mbedtls_rsa_context *)n.p,(mbedtls_mpi *)local_28,(mbedtls_mpi *)0x0,
                           (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0);
  local_2c = mbedtls_to_psa_error(ret);
  if ((local_2c == 0) && (sVar1 = mbedtls_mpi_bitlen((mbedtls_mpi *)local_28), (sVar1 & 7) != 0)) {
    local_2c = -0x86;
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_28);
  return local_2c;
}

Assistant:

static psa_status_t psa_check_rsa_key_byte_aligned(
    const mbedtls_rsa_context *rsa )
{
    mbedtls_mpi n;
    psa_status_t status;
    mbedtls_mpi_init( &n );
    status = mbedtls_to_psa_error(
        mbedtls_rsa_export( rsa, &n, NULL, NULL, NULL, NULL ) );
    if( status == PSA_SUCCESS )
    {
        if( mbedtls_mpi_bitlen( &n ) % 8 != 0 )
            status = PSA_ERROR_NOT_SUPPORTED;
    }
    mbedtls_mpi_free( &n );
    return( status );
}